

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::Next(Parser *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int mask;
  long *plVar8;
  byte *pbVar9;
  ulong *puVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  string *in_RSI;
  undefined8 uVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  size_type *psVar22;
  int iVar23;
  Parser *this_00;
  int iVar24;
  bool bVar25;
  string ch;
  uint64_t val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Parser *local_80;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_80 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&in_RSI[2]._M_string_length,(pointer)in_RSI[2]._M_string_length);
  pcVar3 = (pointer)in_RSI->_M_string_length;
  puVar4 = (undefined1 *)in_RSI[1]._M_string_length;
  (in_RSI->_M_dataplus)._M_p = pcVar3;
  bVar25 = pcVar3 == (pointer)in_RSI[0x39]._M_string_length;
  in_RSI[1].field_2._M_allocated_capacity = 0;
  *puVar4 = 0;
  *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 1;
  psVar22 = &in_RSI[1]._M_string_length;
LAB_00105647:
  this_00 = local_80;
  iVar12 = *(int *)((long)&in_RSI->field_2 + 8);
  pbVar19 = (byte *)in_RSI->_M_string_length;
switchD_00105680_caseD_20:
  pbVar9 = pbVar19;
  pbVar19 = pbVar9 + 1;
  in_RSI->_M_string_length = (size_type)pbVar19;
  bVar14 = *pbVar9;
  uVar13 = (uint)(char)bVar14;
  *(uint *)((long)&in_RSI->field_2 + 0xc) = uVar13;
  uVar15 = (uint)bVar14;
  if (bVar14 < 0x20) {
    if (9 < bVar14) {
      if (bVar14 != 0xd) {
        if (bVar14 != 10) goto switchD_00105680_caseD_21;
        *(byte **)&in_RSI->field_2 = pbVar19;
        piVar1 = (int *)((long)&in_RSI->field_2 + 8);
        *piVar1 = *piVar1 + 1;
        bVar25 = true;
        goto LAB_00105647;
      }
      goto switchD_00105680_caseD_20;
    }
    if (bVar14 == 9) goto switchD_00105680_caseD_20;
    if (uVar15 == 0) {
      in_RSI->_M_string_length = (size_type)pbVar9;
      *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x100;
      goto switchD_00105680_caseD_28;
    }
  }
  else {
    switch(bVar14) {
    case 0x20:
      goto switchD_00105680_caseD_20;
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2a:
    case 0x2b:
    case 0x2d:
    case 0x2e:
      break;
    case 0x22:
    case 0x27:
      bVar7 = *pbVar19;
      if (bVar7 == bVar14) goto LAB_0010582a;
      uVar17 = 0xffffffff;
      local_78 = psVar22;
      goto LAB_0010593a;
    case 0x28:
    case 0x29:
    case 0x2c:
switchD_00105680_caseD_28:
      goto LAB_00105865;
    case 0x2f:
      if (*pbVar19 != 0x2f) {
        if (*pbVar19 == 0x2a) {
          pbVar9 = pbVar9 + 2;
          do {
            in_RSI->_M_string_length = (size_type)pbVar9;
            bVar14 = *pbVar9;
            if (bVar14 == 10) {
              *(byte **)&in_RSI->field_2 = pbVar9;
              iVar12 = iVar12 + 1;
              *(int *)((long)&in_RSI->field_2 + 8) = iVar12;
              bVar14 = *pbVar9;
            }
            else if ((bVar14 == 0x2a) && (bVar14 = 0x2a, pbVar9[1] == 0x2f)) goto LAB_00105717;
            pbVar9 = pbVar9 + 1;
            if (bVar14 == 0) {
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a0,"end of file in comment","");
              this_00 = local_80;
              Error(local_80,in_RSI);
              goto LAB_001057d6;
            }
          } while( true );
        }
        break;
      }
      pbVar19 = pbVar9 + 2;
      while( true ) {
        in_RSI->_M_string_length = (size_type)pbVar19;
        if ((*pbVar19 < 0xe) && ((0x2401U >> (*pbVar19 & 0x1f) & 1) != 0)) break;
        pbVar19 = pbVar19 + 1;
      }
      if (pbVar9[2] == 0x2f) goto LAB_0010573f;
      goto switchD_00105680_caseD_20;
    default:
      if ((bVar14 - 0x3a < 5) ||
         ((bVar14 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar14 - 0x5b) & 0x3f) & 1) != 0))))
      goto switchD_00105680_caseD_28;
    }
  }
switchD_00105680_caseD_21:
  if ((bVar14 == 0x5f) || ((uVar13 & 0xffffffdf) - 0x41 < 0x1a)) {
    bVar14 = *pbVar19;
    if (((int)(char)bVar14 - 0x30U < 10 || bVar14 == 0x5f) ||
        ((int)(char)bVar14 & 0xffffffdfU) - 0x41 < 0x1a) {
      pbVar19 = pbVar9 + 2;
      do {
        in_RSI->_M_string_length = (size_type)pbVar19;
        bVar14 = *pbVar19;
        pbVar19 = pbVar19 + 1;
      } while (((int)(char)bVar14 - 0x30U < 10 || bVar14 == 0x5f) ||
               ((int)(char)bVar14 & 0xffffffdfU) - 0x41 < 0x1a);
    }
    std::__cxx11::string::replace
              ((ulong)psVar22,in_RSI[1].field_2._M_allocated_capacity,(char *)0x0,(ulong)pbVar9);
    *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x104;
    goto LAB_00105865;
  }
  paVar2 = &local_a0.field_2;
  pbVar20 = pbVar19;
  if (uVar15 == 0x2b) {
LAB_001058b9:
    bVar14 = *pbVar19;
    if ((int)(char)bVar14 == 0x69) {
      if (((pbVar9[2] == 0x6e) && (pbVar9[3] == 0x66)) &&
         (bVar14 = pbVar9[4],
         (9 < (int)(char)bVar14 - 0x30U && bVar14 != 0x5f) &&
         0x19 < ((int)(char)bVar14 & 0xffffffdfU) - 0x41)) {
        std::__cxx11::string::replace
                  ((ulong)psVar22,0,(char *)in_RSI[1].field_2._M_allocated_capacity,(ulong)pbVar9);
        *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x103;
        in_RSI->_M_string_length = in_RSI->_M_string_length + 3;
      }
      goto LAB_00105865;
    }
    if ((bVar14 == 0x5f) || (((int)(char)bVar14 & 0xffffffdfU) - 0x41 < 0x1a)) goto LAB_00105865;
LAB_00105f5e:
    if ((0x2e < uVar15) || ((0x680000000000U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) {
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity =
           local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_replace_aux((ulong)&local_a0,0,0,'\x01');
      if (0x5e < uVar13 - 0x20) {
        NumToString<int>(&local_50,uVar13);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x14f7c9);
        puVar10 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_70.field_2._M_allocated_capacity = *puVar10;
          local_70.field_2._8_8_ = plVar8[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *puVar10;
          local_70._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_70._M_string_length = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(&local_70,"illegal character: ",&local_a0);
      Error(this_00,in_RSI);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00105f02;
    }
    bVar25 = true;
    bVar5 = true;
LAB_00105f85:
    if (9 < (int)(char)*pbVar19 - 0x30U) {
      bVar25 = false;
      goto LAB_00106048;
    }
    in_RSI->_M_string_length = (size_type)(pbVar9 + 2);
    bVar14 = pbVar9[1];
    pbVar20 = pbVar9 + 2;
  }
  else {
    if (uVar15 == 0x2e) {
      bVar5 = false;
      bVar25 = false;
      if ((int)(char)*pbVar19 - 0x30U < 10) goto LAB_00105f85;
      goto LAB_00105865;
    }
    if (uVar15 == 0x2d) goto LAB_001058b9;
    if (9 < uVar13 - 0x30) goto LAB_00105f5e;
    bVar25 = true;
    bVar5 = true;
    pbVar19 = pbVar9;
  }
  if (((bVar25) && (bVar14 == 0x30)) && ((*pbVar20 & 0xdf) == 0x58)) {
    pbVar19 = pbVar20 + 1;
    in_RSI->_M_string_length = (size_type)pbVar19;
    bVar25 = true;
    pbVar20 = pbVar19;
  }
  else {
    bVar25 = false;
  }
  goto LAB_00106048;
LAB_00105717:
  in_RSI->_M_string_length = (size_type)(pbVar9 + 2);
  pbVar19 = pbVar9 + 2;
  goto switchD_00105680_caseD_20;
LAB_0010573f:
  if (!bVar25) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"a documentation comment should be on a line on its own","");
    this_00 = local_80;
    Error(local_80,in_RSI);
    goto LAB_001057d6;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_78 = psVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pbVar9 + 3,pbVar19);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &in_RSI[2]._M_string_length,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  bVar25 = true;
  psVar22 = local_78;
  goto LAB_00105647;
code_r0x00105cc1:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  if ((int)uVar17 == -1) {
LAB_0010582a:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    in_RSI->_M_string_length = (size_type)(pbVar19 + 1);
    if ((*(char *)&in_RSI[1]._M_dataplus._M_p != '\0') ||
       (in_RSI[0x25].field_2._M_local_buf[9] != '\0')) {
LAB_00105846:
      *(undefined4 *)((long)&in_RSI->field_2 + 0xc) = 0x101;
LAB_00105865:
      *(undefined2 *)&(this_00->super_ParserState).prev_cursor_ = 0;
      goto LAB_0010586c;
    }
    pbVar19 = (byte *)in_RSI[1]._M_string_length;
    pbVar9 = pbVar19 + in_RSI[1].field_2._M_allocated_capacity;
    do {
      if (pbVar9 <= pbVar19) goto LAB_00105846;
      bVar14 = *pbVar19;
      uVar13 = 0x80;
      iVar12 = 0;
      while ((uVar13 & bVar14) != 0) {
        uVar13 = uVar13 >> 1;
        iVar12 = iVar12 + -1;
        if (iVar12 == -6) goto LAB_00105ed7;
      }
    } while (((-1 < (char)(bVar14 << (-(char)iVar12 & 0x1fU))) && (iVar12 == 0)) &&
            (pbVar19 = pbVar19 + 1, -1 < (char)bVar14));
LAB_00105ed7:
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"illegal UTF-8 sequence","")
    ;
    Error(this_00,in_RSI);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"illegal Unicode sequence (unpaired high surrogate)","");
    Error(this_00,in_RSI);
  }
LAB_00105f02:
  uVar16 = local_a0.field_2._M_allocated_capacity;
  _Var18._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0010586c;
  goto LAB_001057e9;
LAB_00106048:
  bVar14 = *pbVar20;
  uVar13 = (int)(char)bVar14 - 0x30;
  if (bVar25) {
    if ((uVar13 < 10) || (((int)(char)bVar14 & 0xffffffdfU) - 0x41 < 6)) {
      pbVar20 = pbVar20 + 1;
      do {
        do {
          in_RSI->_M_string_length = (size_type)pbVar20;
          bVar14 = *pbVar20;
          pbVar20 = pbVar20 + 1;
        } while ((int)(char)bVar14 - 0x30U < 10);
      } while (((int)(char)bVar14 & 0xffffffdfU) - 0x41 < 6);
LAB_001060a9:
      pbVar20 = pbVar20 + -1;
    }
  }
  else if (uVar13 < 10) {
    pbVar20 = pbVar20 + 1;
    do {
      in_RSI->_M_string_length = (size_type)pbVar20;
      bVar14 = *pbVar20;
      pbVar20 = pbVar20 + 1;
    } while ((int)(char)bVar14 - 0x30U < 10);
    goto LAB_001060a9;
  }
  if (bVar14 == 0x2e) goto code_r0x001060b2;
  if (pbVar20 <= pbVar19) goto LAB_00106157;
  pbVar21 = pbVar19;
  if (!bVar5) {
    pbVar21 = pbVar20;
  }
  if (bVar25) {
    pbVar19 = pbVar21;
  }
  if ((bool)(((bVar14 & 0xdf) != 0x50 | ~bVar25) & (bVar14 & 0xdf) != 0x45)) goto LAB_00106157;
  pbVar19 = pbVar20 + 1;
  in_RSI->_M_string_length = (size_type)pbVar19;
  bVar14 = pbVar20[1];
  if ((bVar14 == 0x2d) || (pbVar21 = pbVar19, bVar14 == 0x2b)) {
    pbVar19 = pbVar20 + 2;
    in_RSI->_M_string_length = (size_type)pbVar19;
    bVar14 = pbVar20[2];
    pbVar21 = pbVar19;
  }
  while (pbVar20 = pbVar21, (int)(char)bVar14 - 0x30U < 10) {
    pbVar21 = pbVar20 + 1;
    in_RSI->_M_string_length = (size_type)pbVar21;
    bVar14 = *pbVar21;
  }
  bVar5 = false;
  if (bVar14 != 0x2e) {
LAB_00106157:
    if (pbVar20 <= pbVar19) goto LAB_00106181;
    std::__cxx11::string::replace
              ((ulong)psVar22,in_RSI[1].field_2._M_allocated_capacity,(char *)0x0,(ulong)pbVar9);
    *(uint *)((long)&in_RSI->field_2 + 0xc) = !bVar5 + 0x102;
    goto LAB_00105865;
  }
  pbVar20 = pbVar20 + 1;
  in_RSI->_M_string_length = (size_type)pbVar20;
LAB_00106181:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pbVar9,pbVar20);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x14f7b8);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_a0.field_2._M_allocated_capacity = *puVar10;
    local_a0.field_2._8_8_ = plVar8[3];
    local_a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *puVar10;
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Error(this_00,in_RSI);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  uVar16 = local_70.field_2._M_allocated_capacity;
  _Var18._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0010586c;
  goto LAB_001057e9;
code_r0x001060b2:
  pbVar20 = pbVar20 + 1;
  in_RSI->_M_string_length = (size_type)pbVar20;
  bVar6 = !bVar5;
  bVar5 = false;
  if (bVar6) goto LAB_00106181;
  goto LAB_00106048;
LAB_0010593a:
  if (bVar7 < 0x20) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"illegal character in string constant","");
    Error(this_00,in_RSI);
    goto LAB_001057d6;
  }
  uVar13 = (uint)uVar17;
  if (bVar7 != 0x5c) {
    if (uVar13 != 0xffffffff) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"illegal Unicode sequence (unpaired high surrogate)","");
      Error(this_00,in_RSI);
      goto LAB_001057d6;
    }
    *(byte *)&in_RSI[1]._M_dataplus._M_p =
         *(byte *)&in_RSI[1]._M_dataplus._M_p & (int)(char)bVar7 - 0x20U < 0x5f;
    in_RSI->_M_string_length = (size_type)(pbVar19 + 1);
LAB_00105a05:
    std::__cxx11::string::push_back((char)psVar22);
LAB_00105cad:
    uVar17 = 0xffffffff;
LAB_00105cb2:
    pbVar19 = (byte *)in_RSI->_M_string_length;
    bVar7 = *pbVar19;
    if (bVar7 == bVar14) goto code_r0x00105cc1;
    goto LAB_0010593a;
  }
  *(undefined1 *)&in_RSI[1]._M_dataplus._M_p = 0;
  in_RSI->_M_string_length = (size_type)(pbVar19 + 1);
  bVar7 = pbVar19[1];
  if (uVar13 == 0xffffffff) {
    if (bVar7 < 0x62) {
      if (bVar7 < 0x2f) {
        if ((bVar7 != 0x22) && (bVar7 != 0x27)) goto switchD_00105a35_caseD_6f;
      }
      else if ((bVar7 != 0x2f) && (bVar7 != 0x5c)) goto switchD_00105a35_caseD_6f;
    }
    else {
      switch(bVar7) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
switchD_00105a35_caseD_6f:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"unknown escape code in string constant","");
        Error(this_00,in_RSI);
        goto LAB_001057d6;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        goto switchD_00105a35_caseD_75;
      case 0x78:
        in_RSI->_M_string_length = (size_type)(pbVar19 + 2);
        ParseHexNum(this_00,(int)in_RSI,(uint64_t *)0x2);
        *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this_00->super_ParserState).prev_cursor_ == '\0') goto LAB_00105a05;
        goto LAB_0010586c;
      default:
        if ((bVar7 != 0x62) && (bVar7 != 0x66)) goto switchD_00105a35_caseD_6f;
      }
    }
    std::__cxx11::string::push_back((char)psVar22);
    in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
    goto LAB_00105cad;
  }
  if (bVar7 != 0x75) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"illegal Unicode sequence (unpaired high surrogate)","");
    Error(this_00,in_RSI);
    goto LAB_001057d6;
  }
switchD_00105a35_caseD_75:
  in_RSI->_M_string_length = (size_type)(pbVar19 + 2);
  ParseHexNum(this_00,(int)in_RSI,(uint64_t *)0x4);
  *(undefined1 *)((long)&(this_00->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this_00->super_ParserState).prev_cursor_ != '\0') goto LAB_0010586c;
  uVar15 = (uint)local_70._M_dataplus._M_p;
  if (((ulong)local_70._M_dataplus._M_p & 0xfffffffffffffc00) == 0xdc00) {
    if (uVar13 == 0xffffffff) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"illegal Unicode sequence (unpaired low surrogate)","");
      Error(this_00,in_RSI);
      goto LAB_001057d6;
    }
    iVar23 = 0;
    cVar11 = '\x06';
    iVar24 = 1;
    iVar12 = -6;
    while ((uVar15 & 0x3ff) + (uVar13 & 0x3ff) * 0x400 + 0x10000 >> ((iVar23 == 0) + cVar11 & 0x1fU)
           != 0) {
      iVar23 = iVar23 + 6;
      cVar11 = cVar11 + '\x05';
      iVar24 = iVar24 + 1;
      iVar12 = iVar12 + 1;
      if (iVar12 == 0) goto LAB_00106473;
    }
    std::__cxx11::string::push_back((char)local_78);
    psVar22 = local_78;
    if (iVar23 != 0) {
      do {
        std::__cxx11::string::push_back((char)psVar22);
        iVar24 = iVar24 + -1;
        this_00 = local_80;
      } while (1 < iVar24);
      goto LAB_00105cad;
    }
LAB_00105be9:
    uVar17 = 0xffffffff;
    psVar22 = local_78;
    this_00 = local_80;
    goto LAB_00105cb2;
  }
  if (((ulong)local_70._M_dataplus._M_p & 0xfffffffffffffc00) == 0xd800) {
    if (uVar13 != 0xffffffff) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"illegal Unicode sequence (multiple high surrogates)","");
      Error(this_00,in_RSI);
      goto LAB_001057d6;
    }
    uVar17 = (ulong)local_70._M_dataplus._M_p & 0xffffffff;
    psVar22 = local_78;
    goto LAB_00105cb2;
  }
  if (uVar13 == 0xffffffff) {
    if ((int)uVar15 < 0) {
      __assert_fail("!(ucc & 0x80000000)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,500,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
    }
    iVar23 = 0;
    cVar11 = '\x06';
    iVar24 = 1;
    iVar12 = -6;
    while (uVar15 >> ((iVar23 == 0) + cVar11 & 0x1fU) != 0) {
      iVar23 = iVar23 + 6;
      cVar11 = cVar11 + '\x05';
      iVar24 = iVar24 + 1;
      iVar12 = iVar12 + 1;
      if (iVar12 == 0) {
LAB_00106473:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x206,"int flatbuffers::ToUTF8(uint32_t, std::string *)");
      }
    }
    std::__cxx11::string::push_back((char)local_78);
    psVar22 = local_78;
    if (iVar23 != 0) {
      do {
        std::__cxx11::string::push_back((char)psVar22);
        iVar24 = iVar24 + -1;
        this_00 = local_80;
      } while (1 < iVar24);
      goto LAB_00105cad;
    }
    goto LAB_00105be9;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"illegal Unicode sequence (unpaired high surrogate)","");
  Error(this_00,in_RSI);
LAB_001057d6:
  uVar16 = local_a0.field_2._M_allocated_capacity;
  _Var18._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0010586c;
LAB_001057e9:
  operator_delete(_Var18._M_p,uVar16 + 1);
LAB_0010586c:
  return SUB82(this_00,0);
}

Assistant:

CheckedError Parser::Next() {
  doc_comment_.clear();
  prev_cursor_ = cursor_;
  bool seen_newline = cursor_ == source_;
  attribute_.clear();
  attr_is_trivial_ascii_string_ = true;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0':
        cursor_--;
        token_ = kTokenEof;
        return NoError();
      case ' ':
      case '\r':
      case '\t': break;
      case '\n':
        MarkNewLine();
        seen_newline = true;
        break;
      case '{':
      case '}':
      case '(':
      case ')':
      case '[':
      case ']':
      case '<':
      case '>':
      case ',':
      case ':':
      case ';':
      case '=': return NoError();
      case '\"':
      case '\'': {
        int unicode_high_surrogate = -1;

        while (*cursor_ != c) {
          if (*cursor_ < ' ' && static_cast<signed char>(*cursor_) >= 0)
            return Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            attr_is_trivial_ascii_string_ = false;  // has escape sequence
            cursor_++;
            if (unicode_high_surrogate != -1 && *cursor_ != 'u') {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            switch (*cursor_) {
              case 'n':
                attribute_ += '\n';
                cursor_++;
                break;
              case 't':
                attribute_ += '\t';
                cursor_++;
                break;
              case 'r':
                attribute_ += '\r';
                cursor_++;
                break;
              case 'b':
                attribute_ += '\b';
                cursor_++;
                break;
              case 'f':
                attribute_ += '\f';
                cursor_++;
                break;
              case '\"':
                attribute_ += '\"';
                cursor_++;
                break;
              case '\'':
                attribute_ += '\'';
                cursor_++;
                break;
              case '\\':
                attribute_ += '\\';
                cursor_++;
                break;
              case '/':
                attribute_ += '/';
                cursor_++;
                break;
              case 'x': {  // Not in the JSON standard
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(2, &val));
                attribute_ += static_cast<char>(val);
                break;
              }
              case 'u': {
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(4, &val));
                if (val >= 0xD800 && val <= 0xDBFF) {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (multiple high surrogates)");
                  } else {
                    unicode_high_surrogate = static_cast<int>(val);
                  }
                } else if (val >= 0xDC00 && val <= 0xDFFF) {
                  if (unicode_high_surrogate == -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired low surrogate)");
                  } else {
                    int code_point = 0x10000 +
                                     ((unicode_high_surrogate & 0x03FF) << 10) +
                                     (val & 0x03FF);
                    ToUTF8(code_point, &attribute_);
                    unicode_high_surrogate = -1;
                  }
                } else {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired high surrogate)");
                  }
                  ToUTF8(static_cast<int>(val), &attribute_);
                }
                break;
              }
              default: return Error("unknown escape code in string constant");
            }
          } else {  // printable chars + UTF-8 bytes
            if (unicode_high_surrogate != -1) {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            // reset if non-printable
            attr_is_trivial_ascii_string_ &=
                check_ascii_range(*cursor_, ' ', '~');

            attribute_ += *cursor_++;
          }
        }
        if (unicode_high_surrogate != -1) {
          return Error("illegal Unicode sequence (unpaired high surrogate)");
        }
        cursor_++;
        if (!attr_is_trivial_ascii_string_ && !opts.allow_non_utf8 &&
            !ValidateUTF8(attribute_)) {
          return Error("illegal UTF-8 sequence");
        }
        token_ = kTokenStringConstant;
        return NoError();
      }
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n' && *cursor_ != '\r') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              return Error(
                  "a documentation comment should be on a line on its own");
            doc_comment_.push_back(std::string(start + 1, cursor_));
          }
          break;
        } else if (*cursor_ == '*') {
          cursor_++;
          // TODO: make nested.
          while (*cursor_ != '*' || cursor_[1] != '/') {
            if (*cursor_ == '\n') MarkNewLine();
            if (!*cursor_) return Error("end of file in comment");
            cursor_++;
          }
          cursor_ += 2;
          break;
        }
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default:
        if (IsIdentifierStart(c)) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (IsIdentifierStart(*cursor_) || is_digit(*cursor_)) cursor_++;
          attribute_.append(start, cursor_);
          token_ = kTokenIdentifier;
          return NoError();
        }

        const auto has_sign = (c == '+') || (c == '-');
        if (has_sign) {
          // Check for +/-inf which is considered a float constant.
          if (strncmp(cursor_, "inf", 3) == 0 &&
              !(IsIdentifierStart(cursor_[3]) || is_digit(cursor_[3]))) {
            attribute_.assign(cursor_ - 1, cursor_ + 3);
            token_ = kTokenFloatConstant;
            cursor_ += 3;
            return NoError();
          }

          if (IsIdentifierStart(*cursor_)) {
            // '-'/'+' and following identifier - it could be a predefined
            // constant. Return the sign in token_, see ParseSingleValue.
            return NoError();
          }
        }

        auto dot_lvl =
            (c == '.') ? 0 : 1;  // dot_lvl==0 <=> exactly one '.' seen
        if (!dot_lvl && !is_digit(*cursor_)) return NoError();  // enum?
        // Parser accepts hexadecimal-floating-literal (see C++ 5.13.4).
        if (is_digit(c) || has_sign || !dot_lvl) {
          const auto start = cursor_ - 1;
          auto start_digits = !is_digit(c) ? cursor_ : cursor_ - 1;
          if (!is_digit(c) && is_digit(*cursor_)) {
            start_digits = cursor_;  // see digit in cursor_ position
            c = *cursor_++;
          }
          // hex-float can't begind with '.'
          auto use_hex = dot_lvl && (c == '0') && is_alpha_char(*cursor_, 'X');
          if (use_hex) start_digits = ++cursor_;  // '0x' is the prefix, skip it
          // Read an integer number or mantisa of float-point number.
          do {
            if (use_hex) {
              while (is_xdigit(*cursor_)) cursor_++;
            } else {
              while (is_digit(*cursor_)) cursor_++;
            }
          } while ((*cursor_ == '.') && (++cursor_) && (--dot_lvl >= 0));
          // Exponent of float-point number.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            // The exponent suffix of hexadecimal float number is mandatory.
            if (use_hex && !dot_lvl) start_digits = cursor_;
            if ((use_hex && is_alpha_char(*cursor_, 'P')) ||
                is_alpha_char(*cursor_, 'E')) {
              dot_lvl = 0;  // Emulate dot to signal about float-point number.
              cursor_++;
              if (*cursor_ == '+' || *cursor_ == '-') cursor_++;
              start_digits = cursor_;  // the exponent-part has to have digits
              // Exponent is decimal integer number
              while (is_digit(*cursor_)) cursor_++;
              if (*cursor_ == '.') {
                cursor_++;  // If see a dot treat it as part of invalid number.
                dot_lvl = -1;  // Fall thru to Error().
              }
            }
          }
          // Finalize.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            attribute_.append(start, cursor_);
            token_ = dot_lvl ? kTokenIntegerConstant : kTokenFloatConstant;
            return NoError();
          } else {
            return Error("invalid number: " + std::string(start, cursor_));
          }
        }
        std::string ch;
        ch = c;
        if (false == check_ascii_range(c, ' ', '~'))
          ch = "code: " + NumToString(c);
        return Error("illegal character: " + ch);
    }
  }
}